

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsFreewheel::ChShaftsFreewheel(ChShaftsFreewheel *this)

{
  ChShaftsCouple::ChShaftsCouple(&this->super_ChShaftsCouple);
  (this->super_ChShaftsCouple).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsFreewheel_01170eb8;
  this->step = 0.2617993877991494;
  this->torque_react = 0.0;
  this->violation = 0.0;
  this->alpha_max = 0.0;
  ChConstraintTwoGenericBoxed::ChConstraintTwoGenericBoxed(&this->constraint);
  this->jamming_mode = false;
  this->phase = 0.0;
  this->free_forward = true;
  return;
}

Assistant:

ChShaftsFreewheel::ChShaftsFreewheel() : 
    step(CH_C_2PI/24.0), 
    torque_react(0), 
    jamming_mode(false), 
    phase(0), 
    violation(0), 
    alpha_max(0),
    free_forward(true) 
{}